

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  u8 uVar1;
  sqlite3 *db;
  ExprList_item *pEVar2;
  Table *pTVar3;
  ushort uVar4;
  Column *data;
  ExprList_item *pEVar5;
  Expr *pEVar6;
  HashElem *pHVar7;
  size_t sVar8;
  ulong uVar9;
  Column *pCVar10;
  Column **extraout_RAX;
  Column **ppCVar11;
  uint uVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  u32 cnt;
  uint h;
  Hash ht;
  uint local_7c;
  Column *local_78;
  i16 *local_70;
  ulong local_68;
  Column **local_60;
  ulong local_58;
  uint local_4c;
  Hash local_48;
  
  db = pParse->db;
  local_48.htsize = 0;
  local_48.count = 0;
  local_48.first = (HashElem *)0x0;
  local_48.ht = (_ht *)0x0;
  uVar12 = 0;
  if (pEList == (ExprList *)0x0) {
    data = (Column *)0x0;
    uVar15 = 0;
  }
  else {
    uVar15 = (ulong)pEList->nExpr;
    data = (Column *)sqlite3DbMallocZero(db,uVar15 << 5);
  }
  *pnCol = (i16)uVar15;
  *paCol = data;
  local_60 = paCol;
  if (0 < (int)uVar15) {
    local_58 = uVar15 & 0xffffffff;
    uVar14 = 0;
    local_78 = data;
    local_70 = pnCol;
    local_68 = uVar15;
    do {
      if (db->mallocFailed != '\0') goto LAB_0015cfa3;
      pEVar2 = pEList->a;
      pEVar6 = pEVar2[uVar14].pExpr;
      while ((pEVar6 != (Expr *)0x0 && ((pEVar6->flags >> 0xc & 1) != 0))) {
        if ((pEVar6->flags >> 0x12 & 1) == 0) {
          pEVar5 = (ExprList_item *)&pEVar6->pLeft;
        }
        else {
          pEVar5 = ((pEVar6->x).pList)->a;
        }
        pEVar6 = pEVar5->pExpr;
      }
      pcVar13 = pEVar2[uVar14].zName;
      if (pcVar13 == (char *)0x0) {
        for (; uVar1 = pEVar6->op, uVar1 == 'z'; pEVar6 = pEVar6->pRight) {
        }
        if (uVar1 == '7') {
          pCVar10 = (Column *)&pEVar6->u;
        }
        else if ((uVar1 == 0x98) && (pTVar3 = pEVar6->pTab, pTVar3 != (Table *)0x0)) {
          uVar4 = pEVar6->iColumn;
          if ((short)uVar4 < 0) {
            uVar4 = pTVar3->iPKey;
          }
          pcVar13 = "rowid";
          if ((short)uVar4 < 0) goto LAB_0015ce61;
          pCVar10 = pTVar3->aCol + uVar4;
        }
        else {
          pCVar10 = (Column *)&pEVar2[uVar14].zSpan;
        }
        pcVar13 = pCVar10->zName;
      }
LAB_0015ce61:
      pcVar13 = sqlite3MPrintf(db,"%s",pcVar13);
      local_7c = 0;
      while (pcVar13 != (char *)0x0) {
        pHVar7 = findElementWithHash(&local_48,pcVar13,&local_4c);
        if ((pHVar7 == (HashElem *)0x0) || (pHVar7->data == (void *)0x0)) {
          data->zName = pcVar13;
          pCVar10 = (Column *)sqlite3HashInsert(&local_48,pcVar13,data);
          uVar12 = (uint)local_68;
          if ((pCVar10 == data) && ((db->mallocFailed == '\0' && (db->bBenignMalloc == '\0')))) {
            db->mallocFailed = '\x01';
            if (0 < db->nVdbeExec) {
              (db->u1).isInterrupted = 1;
            }
            (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
          }
          goto LAB_0015cf8f;
        }
        sVar8 = strlen(pcVar13);
        if ((sVar8 & 0x3fffffff) == 0) {
          uVar15 = 0;
        }
        else {
          uVar9 = (ulong)((uint)sVar8 & 0x3fffffff);
          do {
            if ((long)uVar9 < 2) {
              uVar9 = 0;
              break;
            }
            lVar16 = uVar9 - 1;
            uVar9 = uVar9 - 1;
          } while (0xfffffffffffffff5 < (ulong)(byte)pcVar13[lVar16] - 0x3a);
          uVar15 = (ulong)((uint)sVar8 & 0x3fffffff);
          if (pcVar13[uVar9 & 0xffffffff] == ':') {
            uVar15 = uVar9 & 0xffffffff;
          }
        }
        local_7c = local_7c + 1;
        pcVar13 = sqlite3MPrintf(db,"%.*z:%u",uVar15,pcVar13);
        if (3 < local_7c) {
          sqlite3_randomness(4,&local_7c);
        }
      }
      data->zName = (char *)0x0;
      uVar12 = (uint)local_68;
LAB_0015cf8f:
      uVar14 = uVar14 + 1;
      data = data + 1;
    } while (uVar14 != local_58);
    uVar14 = (ulong)uVar12;
LAB_0015cfa3:
    uVar12 = (uint)uVar14;
    pnCol = local_70;
    data = local_78;
  }
  sqlite3HashClear(&local_48);
  ppCVar11 = extraout_RAX;
  if (db->mallocFailed != '\0') {
    if (uVar12 != 0) {
      lVar16 = 0;
      do {
        sqlite3DbFree(db,*(void **)((long)&data->zName + lVar16));
        lVar16 = lVar16 + 0x20;
      } while ((ulong)uVar12 << 5 != lVar16);
    }
    sqlite3DbFree(db,data);
    *local_60 = (Column *)0x0;
    *pnCol = 0;
    ppCVar11 = local_60;
  }
  return (int)ppCVar11;
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  Expr *p;                    /* Expression for a single result column */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !db->mallocFailed; i++, pCol++){
    /* Get an appropriate name for the column
    */
    p = sqlite3ExprSkipCollate(pEList->a[i].pExpr);
    if( (zName = pEList->a[i].zName)!=0 ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = p;  /* The expression that is the result column name */
      Table *pTab;         /* Table associated with this expression */
      while( pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN && ALWAYS(pColExpr->pTab!=0) ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        pTab = pColExpr->pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        zName = pEList->a[i].zSpan;
      }
    }
    zName = sqlite3MPrintf(db, "%s", zName);

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && sqlite3HashFind(&ht, zName)!=0 ){
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      if( cnt>3 ) sqlite3_randomness(sizeof(cnt), &cnt);
    }
    pCol->zName = zName;
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pCol)==pCol ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM_BKPT;
  }
  return SQLITE_OK;
}